

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr xmlGetPredefinedEntity(xmlChar *name)

{
  int iVar1;
  xmlChar *name_local;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  switch(*name) {
  case 'a':
    iVar1 = xmlStrEqual(name,"amp");
    if (iVar1 != 0) {
      name_local = (xmlChar *)&xmlEntityAmp;
      return (xmlEntityPtr)name_local;
    }
    iVar1 = xmlStrEqual(name,(xmlChar *)"apos");
    if (iVar1 != 0) {
      name_local = (xmlChar *)&xmlEntityApos;
      return (xmlEntityPtr)name_local;
    }
    break;
  default:
    break;
  case 'g':
    iVar1 = xmlStrEqual(name,(xmlChar *)"gt");
    if (iVar1 != 0) {
      name_local = (xmlChar *)&xmlEntityGt;
      return (xmlEntityPtr)name_local;
    }
    break;
  case 'l':
    iVar1 = xmlStrEqual(name,"lt");
    if (iVar1 != 0) {
      name_local = (xmlChar *)&xmlEntityLt;
      return (xmlEntityPtr)name_local;
    }
    break;
  case 'q':
    iVar1 = xmlStrEqual(name,(xmlChar *)"quot");
    if (iVar1 != 0) {
      name_local = (xmlChar *)&xmlEntityQuot;
      return (xmlEntityPtr)name_local;
    }
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlGetPredefinedEntity(const xmlChar *name) {
    if (name == NULL) return(NULL);
    switch (name[0]) {
        case 'l':
	    if (xmlStrEqual(name, BAD_CAST "lt"))
	        return(&xmlEntityLt);
	    break;
        case 'g':
	    if (xmlStrEqual(name, BAD_CAST "gt"))
	        return(&xmlEntityGt);
	    break;
        case 'a':
	    if (xmlStrEqual(name, BAD_CAST "amp"))
	        return(&xmlEntityAmp);
	    if (xmlStrEqual(name, BAD_CAST "apos"))
	        return(&xmlEntityApos);
	    break;
        case 'q':
	    if (xmlStrEqual(name, BAD_CAST "quot"))
	        return(&xmlEntityQuot);
	    break;
	default:
	    break;
    }
    return(NULL);
}